

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

HighsStatus __thiscall HEkk::dualize(HEkk *this)

{
  int iVar1;
  int iVar2;
  value_type vVar3;
  uint uVar4;
  bool bVar5;
  HighsInt HVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  pointer piVar10;
  size_type sVar11;
  uint uVar12;
  vector<double,_std::allocator<double>_> *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  bool ignore_scaling;
  HighsInt dual_num_row;
  HighsInt dual_num_col;
  HighsInt iEl_3;
  double cost_1;
  HighsInt iCol_4;
  size_t iX_3;
  vector<double,_std::allocator<double>_> primal_bound_1;
  HighsInt iEl_2;
  double multiplier;
  HighsInt iCol_3;
  size_t iX_2;
  double delta_offset;
  HighsInt extra_columns_iEl;
  HighsInt iRow_3;
  HighsInt iEl_1;
  HighsInt iCol_2;
  HighsInt extra_columns_num_nz;
  HighsInt iRow_2;
  HighsInt iEl;
  double upper_3;
  HighsInt iRow_1;
  HighsInt iX_1;
  HighsInt extra_iRow;
  vector<int,_std::allocator<int>_> count;
  vector<int,_std::allocator<int>_> indirection;
  HighsInt dummy_row;
  double upper_2;
  HighsInt iCol_1;
  HighsInt iX;
  double one;
  HighsInt num_upper_bound_row;
  HighsInt num_upper_bound_col;
  HighsSparseMatrix extra_columns;
  vector<double,_std::allocator<double>_> *value;
  vector<int,_std::allocator<int>_> *index;
  vector<int,_std::allocator<int>_> *start;
  double col_upper;
  double col_lower;
  double col_cost;
  double upper_1;
  double lower_1;
  HighsInt iRow;
  double row_upper;
  double row_lower;
  double primal_bound;
  double upper;
  double lower;
  double cost;
  HighsInt iCol;
  double inf;
  vector<int,_std::allocator<int>_> primal_bound_index;
  vector<double,_std::allocator<double>_> primal_bound_value;
  HighsSparseMatrix dual_matrix;
  HighsSparseMatrix *in_stack_fffffffffffffc18;
  pointer *ppdVar13;
  HighsSparseMatrix *in_stack_fffffffffffffc20;
  value_type_conflict1 *in_stack_fffffffffffffc28;
  value_type vVar14;
  undefined4 in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc34;
  size_type in_stack_fffffffffffffc38;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc40;
  HighsSparseMatrix *in_stack_fffffffffffffc48;
  HighsSparseMatrix *in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  pointer piVar15;
  HighsSparseMatrix *in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  HighsSparseMatrix *in_stack_fffffffffffffcf0;
  int8_t *in_stack_fffffffffffffd30;
  HighsSparseMatrix *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  HighsSparseMatrix *local_2b8;
  int local_2ac;
  size_type local_2a8;
  HighsSparseMatrix local_298;
  value_type local_228;
  int local_220;
  int local_21c;
  int local_218;
  undefined4 local_214;
  vector<int,_std::allocator<int>_> local_210;
  vector<int,_std::allocator<int>_> local_1f8;
  uint local_1dc;
  undefined8 local_1d8;
  undefined8 local_1d0;
  value_type local_1c8;
  int local_1c0;
  int local_1bc;
  undefined8 local_1b8;
  uint local_1b0;
  uint local_1ac;
  int local_1a4;
  undefined4 local_1a0;
  vector<int,_std::allocator<int>_> local_198 [2];
  vector<int,_std::allocator<int>_> local_168;
  vector<double,_std::allocator<double>_> local_150;
  pointer *local_138;
  pointer *local_130;
  pointer *local_128;
  undefined8 local_120;
  undefined8 local_118;
  double local_110;
  double local_108;
  double local_100;
  int local_f8;
  value_type local_e8;
  value_type local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  value_type local_c0;
  int local_b4;
  undefined8 local_b0;
  vector<int,_std::allocator<int>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  
  *(undefined4 *)
   &in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
       *(undefined4 *)
        &in_RDI[0x166].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  *(undefined4 *)
   ((long)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) =
       *(undefined4 *)
        ((long)&in_RDI[0x166].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish + 4);
  HVar6 = HighsSparseMatrix::numNz(in_stack_fffffffffffffc18);
  *(HighsInt *)
   &in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = HVar6;
  in_RDI[0x251].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = in_RDI[0x170].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),in_RDI);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),in_RDI);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),in_RDI);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),in_RDI);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffffcc7,in_stack_fffffffffffffcc0),in_RDI);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc50,
             (size_type)in_stack_fffffffffffffc48);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc50,
             (size_type)in_stack_fffffffffffffc48);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc50,
             (size_type)in_stack_fffffffffffffc48);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc50,
             (size_type)in_stack_fffffffffffffc48);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc50,
             (size_type)in_stack_fffffffffffffc48);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  HighsSparseMatrix::HighsSparseMatrix(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  local_70 = *(undefined4 *)
              &in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_74 = *(undefined4 *)
              ((long)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + 4);
  local_78 = 2;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x76889d);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7688aa);
  local_b0 = 0x7ff0000000000000;
  local_2b8 = in_stack_fffffffffffffc20;
  for (local_b4 = 0;
      local_b4 <
      *(int *)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish; local_b4 = local_b4 + 1) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x251].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_b4);
    local_c0 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x252].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_b4);
    local_c8 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x253].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_b4);
    local_d0 = *pvVar7;
    local_d8 = INFINITY;
    local_e0 = INFINITY;
    local_e8 = -INFINITY;
    if ((local_c8 != local_d0) || (NAN(local_c8) || NAN(local_d0))) {
      bVar5 = highs_isInfinity(-local_c8);
      if (bVar5) {
        bVar5 = highs_isInfinity(local_d0);
        if (bVar5) {
          local_d8 = 0.0;
          local_e8 = local_c0;
        }
        else {
          local_d8 = local_d0;
          local_e8 = INFINITY;
        }
        local_e0 = local_c0;
      }
      else {
        bVar5 = highs_isInfinity(local_d0);
        if (bVar5) {
          local_d8 = local_c8;
          local_e0 = -INFINITY;
          local_e8 = local_c0;
        }
        else {
          local_d8 = local_c8;
          local_e0 = -INFINITY;
          local_e8 = local_c0;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     (value_type_conflict2 *)in_stack_fffffffffffffc28);
        }
      }
    }
    else {
      local_d8 = local_c8;
      local_e0 = -INFINITY;
      local_e8 = INFINITY;
    }
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28);
    if ((local_d8 != 0.0) || (NAN(local_d8))) {
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 in_stack_fffffffffffffc28);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (value_type_conflict2 *)in_stack_fffffffffffffc28);
    }
  }
  for (local_f8 = 0;
      local_f8 <
      *(int *)((long)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + 4); local_f8 = local_f8 + 1) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x254].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_f8);
    local_100 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x255].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_f8);
    local_108 = *pvVar7;
    local_110 = INFINITY;
    local_118 = 0x7ff0000000000000;
    local_120 = 0xfff0000000000000;
    if ((local_100 != local_108) || (NAN(local_100) || NAN(local_108))) {
      bVar5 = highs_isInfinity(-local_100);
      if (bVar5) {
        bVar5 = highs_isInfinity(local_108);
        if (bVar5) {
          local_110 = 0.0;
          local_118 = 0;
        }
        else {
          local_110 = local_108;
          local_118 = 0xfff0000000000000;
        }
        local_120 = 0;
      }
      else {
        bVar5 = highs_isInfinity(local_108);
        if (bVar5) {
          local_110 = local_100;
          local_118 = 0;
          local_120 = 0x7ff0000000000000;
        }
        else {
          local_110 = local_100;
          local_118 = 0;
          local_120 = 0x7ff0000000000000;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     (value_type_conflict2 *)in_stack_fffffffffffffc28);
        }
      }
    }
    else {
      local_110 = local_100;
      local_118 = 0xfff0000000000000;
      local_120 = 0x7ff0000000000000;
    }
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28);
  }
  local_128 = &in_RDI[0x16c].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_130 = &in_RDI[0x16e].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_138 = &in_RDI[0x16f].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
  HighsSparseMatrix::HighsSparseMatrix(in_stack_fffffffffffffc50);
  HighsSparseMatrix::ensureColwise(in_stack_fffffffffffffcf0);
  local_1a0 = *(undefined4 *)
               &in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     &in_RDI[0x256].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  local_1ac = (uint)sVar8;
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     &in_RDI[599].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  local_1b0 = (uint)sVar8;
  local_1b8 = 0x3ff0000000000000;
  for (local_1bc = 0; local_1bc < (int)local_1ac; local_1bc = local_1bc + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[0x256].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_1bc);
    local_1c0 = *pvVar9;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x253].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_1c0);
    local_1c8 = *pvVar7;
    HighsSparseMatrix::addVec
              (in_stack_fffffffffffffc60,(HighsInt)((ulong)in_stack_fffffffffffffc58 >> 0x20),
               (HighsInt *)in_stack_fffffffffffffc50,(double *)in_stack_fffffffffffffc48,
               (double)in_stack_fffffffffffffc40);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               in_stack_fffffffffffffc28);
    local_1d0 = 0xfff0000000000000;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_2b8,
               (value_type_conflict1 *)in_stack_fffffffffffffc18);
    local_1d8 = 0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_2b8,
               (value_type_conflict1 *)in_stack_fffffffffffffc18);
  }
  if (local_1b0 != 0) {
    local_1dc = local_1b0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7690e7);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7690f4);
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)local_2b8,(size_type)in_stack_fffffffffffffc18,
               (value_type_conflict2 *)0x769118);
    local_214 = 0;
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)local_2b8,(size_type)in_stack_fffffffffffffc18,
               (value_type_conflict2 *)0x769146);
    local_218 = 0;
    for (local_21c = 0; local_21c < (int)local_1b0; local_21c = local_21c + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[599].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)local_21c);
      iVar1 = local_218;
      local_220 = *pvVar9;
      local_218 = local_218 + 1;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_1f8,(long)local_220);
      *pvVar9 = iVar1;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[0x255].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_finish,(long)local_220);
      local_228 = *pvVar7;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 in_stack_fffffffffffffc28);
      local_298.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0xfff0000000000000;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)local_2b8,
                 (value_type_conflict1 *)in_stack_fffffffffffffc18);
      local_298.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)local_2b8,
                 (value_type_conflict1 *)in_stack_fffffffffffffc18);
    }
    for (local_298.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start._4_4_ = 0;
        local_298.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ <
        *(int *)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        local_298.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ =
             local_298.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start._4_4_ + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_130,
                          (long)local_298.value_.super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_1f8,(long)*pvVar9);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_210,(long)*pvVar9);
      *pvVar9 = *pvVar9 + 1;
    }
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc40,
               in_stack_fffffffffffffc38);
    for (local_298.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start._0_4_ = 0;
        (int)local_298.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start < (int)local_1b0;
        local_298.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ =
             (int)local_298.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         (local_198,
                          (long)(int)(local_1ac +
                                     (int)local_298.value_.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start));
      iVar1 = *pvVar9;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&local_210,
                          (long)(int)local_298.value_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start);
      iVar2 = *pvVar9;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         (local_198,
                          (long)(int)(local_1ac +
                                      (int)local_298.value_.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start + 1));
      *pvVar9 = iVar1 + iVar2;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         (local_198,
                          (long)(int)(local_1ac +
                                     (int)local_298.value_.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start));
      vVar3 = *pvVar9;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&local_210,
                          (long)(int)local_298.value_.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start);
      *pvVar9 = vVar3;
    }
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       (local_198,(long)(int)(local_1ac + local_1b0));
    local_298.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = *pvVar9;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc40,
               in_stack_fffffffffffffc38);
    std::vector<double,_std::allocator<double>_>::resize
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    for (local_298.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)local_298.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage <
        *(int *)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_298.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)local_298.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_128,
                          (long)(int)local_298.index_.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
      for (local_298.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_ = *pvVar9;
          iVar1 = local_298.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish._4_4_,
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_128,
                              (long)((int)local_298.index_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage + 1)),
          iVar1 < *pvVar9;
          local_298.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ =
               local_298.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish._4_4_ + 1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_130,
                            (long)local_298.index_.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_1f8,(long)*pvVar9);
        local_298.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = *pvVar9;
        if ((int)local_298.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish < (int)local_1b0) {
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_210,
                              (long)(int)local_298.index_.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish);
          vVar3 = (int)local_298.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
          local_298.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ = *pvVar9;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_168,
                              (long)local_298.index_.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_);
          *pvVar9 = vVar3;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_138,
                              (long)local_298.index_.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_);
          vVar14 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_150,
                              (long)local_298.index_.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_);
          *pvVar7 = vVar14;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_210,
                              (long)(int)local_298.index_.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish);
          *pvVar9 = *pvVar9 + 1;
        }
      }
    }
    local_1a4 = local_1b0 + local_1a4;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  }
  local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = (pointer)0x0;
      piVar15 = local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish,
      piVar10 = (pointer)std::vector<int,_std::allocator<int>_>::size(&local_a8), piVar15 < piVar10;
      local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)((long)local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish + 1)) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&local_a8,
                        (size_type)
                        local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._4_4_ = *pvVar9;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_90,
                        (size_type)
                        local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    piVar15 = (pointer)*pvVar7;
    local_298.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar15;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x251].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                        (long)local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start._4_4_);
    local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((double)piVar15 * *pvVar7 +
                  (double)local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_128,
                        (long)local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start._4_4_);
    for (local_298.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish._4_4_ = *pvVar9;
        iVar1 = local_298.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish._4_4_,
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_128,
                            (long)(local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_ + 1)),
        iVar1 < *pvVar9;
        local_298.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ =
             local_298.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish._4_4_ + 1) {
      piVar15 = local_298.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_138,
                          (long)local_298.start_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish._4_4_);
      vVar14 = *pvVar7;
      in_stack_fffffffffffffc50 =
           (HighsSparseMatrix *)
           &in_RDI[0x166].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_130,
                          (long)local_298.start_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish._4_4_);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc50,
                          (long)*pvVar9);
      *pvVar7 = -(double)piVar15 * vVar14 + *pvVar7;
    }
  }
  if (local_1a4 != 0) {
    in_stack_fffffffffffffc48 = &local_298;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x769878);
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)local_2b8,
               (size_type)in_stack_fffffffffffffc18,(value_type_conflict1 *)0x7698a5);
    local_2a8 = 0;
    while (sVar8 = local_2a8, sVar11 = std::vector<int,_std::allocator<int>_>::size(&local_a8),
          sVar8 < sVar11) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,local_2a8);
      vVar14 = *pvVar7;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_a8,local_2a8);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&local_298,(long)*pvVar9);
      *pvVar7 = vVar14;
      local_2a8 = local_2a8 + 1;
    }
    for (local_2ac = 0; local_2ac < local_1a4; local_2ac = local_2ac + 1) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[0x166].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,
                          (long)(*(int *)((long)&in_RDI[0x250].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + 4) +
                                local_2ac));
      local_2b8 = (HighsSparseMatrix *)*pvVar7;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](local_198,(long)local_2ac);
      in_stack_fffffffffffffc34 = *pvVar9;
      while (in_stack_fffffffffffffd44 = in_stack_fffffffffffffc34,
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               (local_198,(long)(local_2ac + 1)),
            in_stack_fffffffffffffc34 < *pvVar9) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&local_168,(long)in_stack_fffffffffffffd44);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&local_298,(long)*pvVar9);
        vVar14 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_150,(long)in_stack_fffffffffffffd44);
        local_2b8 = (HighsSparseMatrix *)(-vVar14 * *pvVar7 + (double)local_2b8);
        in_stack_fffffffffffffc34 = in_stack_fffffffffffffd44 + 1;
      }
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[0x166].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,
                          (long)(*(int *)((long)&in_RDI[0x250].
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + 4) +
                                local_2ac));
      *pvVar7 = (value_type)local_2b8;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  }
  in_RDI[0x170].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)((double)in_RDI[0x170].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage +
                (double)local_298.p_end_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
  HighsSparseMatrix::operator=(local_2b8,in_stack_fffffffffffffc18);
  HighsSparseMatrix::ensureColwise(in_stack_fffffffffffffcf0);
  ppdVar13 = &in_RDI[0x16b].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  HighsSparseMatrix::HighsSparseMatrix(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  HighsSparseMatrix::addCols
            ((HighsSparseMatrix *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  HighsSparseMatrix::~HighsSparseMatrix(local_2b8);
  uVar12 = *(int *)((long)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_finish + 4) + local_1ac + local_1b0;
  uVar4 = *(uint *)&in_RDI[0x250].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish;
  if (*(int *)&in_RDI[0x170].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish == 1) {
    *(undefined4 *)
     &in_RDI[0x170].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = 0xffffffff;
  }
  else {
    *(undefined4 *)
     &in_RDI[0x170].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = 1;
  }
  *(uint *)&in_RDI[0x166].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = uVar12;
  *(uint *)((long)&in_RDI[0x166].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish + 4) = uVar4;
  *(undefined1 *)
   ((long)&in_RDI[0x18e].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 1) = 1;
  *(undefined1 *)
   ((long)&in_RDI[0x18e].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined1 *)
   ((long)&in_RDI[0x18e].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 5) = 0;
  *(undefined1 *)
   ((long)&in_RDI[0x18e].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + 6) = 0;
  highsLogUser((HighsLogOptions *)
               ((in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish + 0x70),kInfo,"Solving dual LP with %d columns",
               (ulong)uVar12,in_R8,in_R9,ppdVar13);
  if (local_1ac + local_1b0 != 0) {
    highsLogUser((HighsLogOptions *)
                 ((in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish + 0x70),kInfo," [%d extra from",
                 (ulong)(uVar12 - *(int *)((long)&in_RDI[0x250].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish + 4)));
    if (local_1ac != 0) {
      highsLogUser((HighsLogOptions *)
                   ((in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish + 0x70),kInfo," %d boxed variable(s)",
                   (ulong)local_1ac);
    }
    if ((local_1ac != 0) && (local_1b0 != 0)) {
      highsLogUser((HighsLogOptions *)
                   ((in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish + 0x70),kInfo," and");
    }
    if (local_1b0 != 0) {
      highsLogUser((HighsLogOptions *)
                   ((in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish + 0x70),kInfo," %d boxed constraint(s)",
                   (ulong)local_1b0);
    }
    highsLogUser((HighsLogOptions *)
                 ((in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish + 0x70),kInfo,"]");
  }
  highsLogUser((HighsLogOptions *)
               ((in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish + 0x70),kInfo," and %d rows\n",(ulong)uVar4);
  HighsSparseMatrix::~HighsSparseMatrix(local_2b8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  HighsSparseMatrix::~HighsSparseMatrix(local_2b8);
  return kOk;
}

Assistant:

HighsStatus HEkk::dualize() {
  assert(lp_.a_matrix_.isColwise());
  original_num_col_ = lp_.num_col_;
  original_num_row_ = lp_.num_row_;
  original_num_nz_ = lp_.a_matrix_.numNz();
  original_offset_ = lp_.offset_;
  original_col_cost_ = lp_.col_cost_;
  original_col_lower_ = lp_.col_lower_;
  original_col_upper_ = lp_.col_upper_;
  original_row_lower_ = lp_.row_lower_;
  original_row_upper_ = lp_.row_upper_;
  // Reserve space for simple dual
  lp_.col_cost_.reserve(original_num_row_);
  lp_.col_lower_.reserve(original_num_row_);
  lp_.col_upper_.reserve(original_num_row_);
  lp_.row_lower_.reserve(original_num_col_);
  lp_.row_upper_.reserve(original_num_col_);
  // Invalidate the original data
  lp_.col_cost_.resize(0);
  lp_.col_lower_.resize(0);
  lp_.col_upper_.resize(0);
  lp_.row_lower_.resize(0);
  lp_.row_upper_.resize(0);
  // The bulk of the constraint matrix of the dual LP is the transpose
  // of the primal constraint matrix. This is obtained row-wise by
  // copying the matrix and flipping the dimensions
  HighsSparseMatrix dual_matrix = lp_.a_matrix_;
  dual_matrix.num_row_ = original_num_col_;
  dual_matrix.num_col_ = original_num_row_;
  dual_matrix.format_ = MatrixFormat::kRowwise;
  // The primal_bound_value vector accumulates the values of the
  // finite bounds on variables - or zero for a free variable - used
  // later to compute the offset and shift for the costs. Many of
  // these components will be zero - all for the case x>=0 - so
  // maintain a list of the nonzeros and corresponding indices. Don't
  // reserve space since they may not be needed
  vector<double> primal_bound_value;
  vector<HighsInt> primal_bound_index;
  const double inf = kHighsInf;
  for (HighsInt iCol = 0; iCol < original_num_col_; iCol++) {
    const double cost = original_col_cost_[iCol];
    const double lower = original_col_lower_[iCol];
    const double upper = original_col_upper_[iCol];
    double primal_bound = inf;
    double row_lower = inf;
    double row_upper = -inf;
    if (lower == upper) {
      // Fixed
      primal_bound = lower;
      // Dual activity a^Ty is free, implying dual for primal column
      // (slack for dual row) is free
      row_lower = -inf;
      row_upper = inf;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        //
        // Treat as lower
        primal_bound = lower;
        // Dual activity a^Ty is bounded above by cost, implying dual
        // for primal column (slack for dual row) is non-negative
        row_lower = -inf;
        row_upper = cost;
        // Treat upper bound as additional constraint
        upper_bound_col_.push_back(iCol);
      } else {
        // Lower (since upper bound is infinite)
        primal_bound = lower;
        // Dual activity a^Ty is bounded above by cost, implying dual
        // for primal column (slack for dual row) is non-negative
        row_lower = -inf;
        row_upper = cost;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      primal_bound = upper;
      // Dual activity a^Ty is bounded below by cost, implying dual
      // for primal column (slack for dual row) is non-positive
      row_lower = cost;
      row_upper = inf;
    } else {
      // FREE
      //
      // Dual activity a^Ty is fixed by cost, implying dual for primal
      // column (slack for dual row) is fixed at zero
      primal_bound = 0;
      row_lower = cost;
      row_upper = cost;
    }
    assert(row_lower < inf);
    assert(row_upper > -inf);
    assert(primal_bound < inf);
    lp_.row_lower_.push_back(row_lower);
    lp_.row_upper_.push_back(row_upper);
    if (primal_bound) {
      primal_bound_value.push_back(primal_bound);
      primal_bound_index.push_back(iCol);
    }
  }
  for (HighsInt iRow = 0; iRow < original_num_row_; iRow++) {
    double lower = original_row_lower_[iRow];
    double upper = original_row_upper_[iRow];
    double col_cost = inf;
    double col_lower = inf;
    double col_upper = -inf;
    if (lower == upper) {
      // Equality constraint
      //
      // Dual variable has primal RHS as cost and is free
      col_cost = lower;
      col_lower = -inf;
      col_upper = inf;
    } else if (!highs_isInfinity(-lower)) {
      // Finite lower bound so boxed or lower
      if (!highs_isInfinity(upper)) {
        // Finite upper bound so boxed
        //
        // Treat as lower
        col_cost = lower;
        col_lower = 0;
        col_upper = inf;
        // Treat upper bound as additional constraint
        upper_bound_row_.push_back(iRow);
      } else {
        // Lower (since upper bound is infinite)
        col_cost = lower;
        col_lower = 0;
        col_upper = inf;
      }
    } else if (!highs_isInfinity(upper)) {
      // Upper
      col_cost = upper;
      col_lower = -inf;
      col_upper = 0;
    } else {
      // FREE
      // Shouldn't get free rows, but handle them anyway
      col_cost = 0;
      col_lower = 0;
      col_upper = 0;
    }
    assert(col_lower < inf);
    assert(col_upper > -inf);
    assert(col_cost < inf);
    lp_.col_cost_.push_back(col_cost);
    lp_.col_lower_.push_back(col_lower);
    lp_.col_upper_.push_back(col_upper);
  }
  vector<HighsInt>& start = lp_.a_matrix_.start_;
  vector<HighsInt>& index = lp_.a_matrix_.index_;
  vector<double>& value = lp_.a_matrix_.value_;
  // Boxed variables and constraints yield extra columns in the dual LP
  HighsSparseMatrix extra_columns;
  extra_columns.ensureColwise();
  extra_columns.num_row_ = original_num_col_;
  HighsInt num_upper_bound_col = upper_bound_col_.size();
  HighsInt num_upper_bound_row = upper_bound_row_.size();
  double one = 1;
  for (HighsInt iX = 0; iX < num_upper_bound_col; iX++) {
    HighsInt iCol = upper_bound_col_[iX];
    const double upper = original_col_upper_[iCol];
    extra_columns.addVec(1, &iCol, &one);
    lp_.col_cost_.push_back(upper);
    lp_.col_lower_.push_back(-inf);
    lp_.col_upper_.push_back(0);
  }

  if (num_upper_bound_row) {
    // Need to identify the submatrix of constraint matrix rows
    // corresponding to those with a row index in
    // upper_bound_row_. When identifying numbers of entries in each
    // row of submatrix, use indirection to get corresponding row
    // index, with a dummy row for rows not in the submatrix.
    HighsInt dummy_row = num_upper_bound_row;
    vector<HighsInt> indirection;
    vector<HighsInt> count;
    indirection.assign(original_num_row_, dummy_row);
    count.assign(num_upper_bound_row + 1, 0);
    HighsInt extra_iRow = 0;
    for (HighsInt iX = 0; iX < num_upper_bound_row; iX++) {
      HighsInt iRow = upper_bound_row_[iX];
      indirection[iRow] = extra_iRow++;
      double upper = original_row_upper_[iRow];
      lp_.col_cost_.push_back(upper);
      lp_.col_lower_.push_back(-inf);
      lp_.col_upper_.push_back(0);
    }
    for (HighsInt iEl = 0; iEl < original_num_nz_; iEl++)
      count[indirection[index[iEl]]]++;
    extra_columns.start_.resize(num_upper_bound_col + num_upper_bound_row + 1);
    for (HighsInt iRow = 0; iRow < num_upper_bound_row; iRow++) {
      extra_columns.start_[num_upper_bound_col + iRow + 1] =
          extra_columns.start_[num_upper_bound_col + iRow] + count[iRow];
      count[iRow] = extra_columns.start_[num_upper_bound_col + iRow];
    }
    HighsInt extra_columns_num_nz =
        extra_columns.start_[num_upper_bound_col + num_upper_bound_row];
    extra_columns.index_.resize(extra_columns_num_nz);
    extra_columns.value_.resize(extra_columns_num_nz);
    for (HighsInt iCol = 0; iCol < original_num_col_; iCol++) {
      for (HighsInt iEl = start[iCol]; iEl < start[iCol + 1]; iEl++) {
        HighsInt iRow = indirection[index[iEl]];
        if (iRow < num_upper_bound_row) {
          HighsInt extra_columns_iEl = count[iRow];
          assert(extra_columns_iEl < extra_columns_num_nz);
          extra_columns.index_[extra_columns_iEl] = iCol;
          extra_columns.value_[extra_columns_iEl] = value[iEl];
          count[iRow]++;
        }
      }
    }
    extra_columns.num_col_ += num_upper_bound_row;
  }
  // Incorporate the cost shift by subtracting A*primal_bound from the
  // cost vector; compute the objective offset
  double delta_offset = 0;
  for (size_t iX = 0; iX < primal_bound_index.size(); iX++) {
    HighsInt iCol = primal_bound_index[iX];
    double multiplier = primal_bound_value[iX];
    delta_offset += multiplier * original_col_cost_[iCol];
    for (HighsInt iEl = start[iCol]; iEl < start[iCol + 1]; iEl++)
      lp_.col_cost_[index[iEl]] -= multiplier * value[iEl];
  }
  if (extra_columns.num_col_) {
    // Incorporate the cost shift by subtracting
    // extra_columns*primal_bound from the cost vector for the extra
    // dual variables
    //
    // Have to scatter the packed primal bound values into a
    // full-length vector
    //
    // ToDo Make this more efficient?
    vector<double> primal_bound;
    primal_bound.assign(original_num_col_, 0);
    for (size_t iX = 0; iX < primal_bound_index.size(); iX++)
      primal_bound[primal_bound_index[iX]] = primal_bound_value[iX];

    for (HighsInt iCol = 0; iCol < extra_columns.num_col_; iCol++) {
      double cost = lp_.col_cost_[original_num_row_ + iCol];
      for (HighsInt iEl = extra_columns.start_[iCol];
           iEl < extra_columns.start_[iCol + 1]; iEl++)
        cost -=
            primal_bound[extra_columns.index_[iEl]] * extra_columns.value_[iEl];
      lp_.col_cost_[original_num_row_ + iCol] = cost;
    }
  }
  lp_.offset_ += delta_offset;
  // Copy the row-wise dual LP constraint matrix and transpose it.
  // ToDo Make this more efficient
  lp_.a_matrix_ = dual_matrix;
  lp_.a_matrix_.ensureColwise();
  // Add the extra columns to the dual LP constraint matrix
  lp_.a_matrix_.addCols(extra_columns);

  HighsInt dual_num_col =
      original_num_row_ + num_upper_bound_col + num_upper_bound_row;
  HighsInt dual_num_row = original_num_col_;
  assert(dual_num_col == (int)lp_.col_cost_.size());
  assert(lp_.a_matrix_.num_col_ == dual_num_col);
  const bool ignore_scaling = true;
  if (!ignore_scaling) {
    // Flip any scale factors
    if (lp_.scale_.has_scaling) {
      std::vector<double> temp_scale = lp_.scale_.row;
      lp_.scale_.row = lp_.scale_.col;
      lp_.scale_.col = temp_scale;
      lp_.scale_.num_col = dual_num_col;
      lp_.scale_.num_row = dual_num_row;
    }
  }
  // Change optimization sense
  if (lp_.sense_ == ObjSense::kMinimize) {
    lp_.sense_ = ObjSense::kMaximize;
  } else {
    lp_.sense_ = ObjSense::kMinimize;
  }
  // Flip LP dimensions
  lp_.num_col_ = dual_num_col;
  lp_.num_row_ = dual_num_row;
  status_.is_dualized = true;
  status_.has_basis = false;
  status_.has_ar_matrix = false;
  status_.has_nla = false;
  highsLogUser(options_->log_options, HighsLogType::kInfo,
               "Solving dual LP with %d columns", (int)dual_num_col);
  if (num_upper_bound_col + num_upper_bound_row) {
    highsLogUser(options_->log_options, HighsLogType::kInfo, " [%d extra from",
                 (int)dual_num_col - original_num_row_);
    if (num_upper_bound_col)
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   " %d boxed variable(s)", (int)num_upper_bound_col);
    if (num_upper_bound_col && num_upper_bound_row)
      highsLogUser(options_->log_options, HighsLogType::kInfo, " and");
    if (num_upper_bound_row)
      highsLogUser(options_->log_options, HighsLogType::kInfo,
                   " %d boxed constraint(s)", (int)num_upper_bound_row);
    highsLogUser(options_->log_options, HighsLogType::kInfo, "]");
  }
  highsLogUser(options_->log_options, HighsLogType::kInfo, " and %d rows\n",
               (int)dual_num_row);
  //  reportLp(options_->log_options, lp_, HighsLogType::kVerbose);
  return HighsStatus::kOk;
}